

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::fill_n<fmt::v8::appender,unsigned_long,char>
                   (appender out,unsigned_long count,char *value)

{
  back_insert_iterator<fmt::v8::detail::buffer<char>_> this;
  appender *in_RDX;
  ulong in_RSI;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_RDI;
  unsigned_long i;
  appender *__value;
  ulong local_28;
  
  for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
    __value = in_RDX;
    this.container = (buffer<char> *)appender::operator++(in_RDX,0);
    std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator*
              ((back_insert_iterator<fmt::v8::detail::buffer<char>_> *)&stack0xffffffffffffffd0);
    std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator=
              ((back_insert_iterator<fmt::v8::detail::buffer<char>_> *)this.container,
               (value_type_conflict1 *)__value);
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)in_RDI.container;
}

Assistant:

FMT_CONSTEXPR auto fill_n(OutputIt out, Size count, const T& value)
    -> OutputIt {
  for (Size i = 0; i < count; ++i) *out++ = value;
  return out;
}